

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

cni_holder_base *
cs_impl::cni::
construct_helper<void(*)(cs_impl::fiber::Channel<cs_impl::any>&,std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>const&)>
::
_construct<void(&)(cs_impl::fiber::Channel<cs_impl::any>&,std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>const&),void,cs_impl::fiber::Channel<cs_impl::any>&,std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>const&>
          (_func_void_Channel<cs_impl::any>_ptr_shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_ptr
           *val,_func_void_Channel<cs_impl::any>_ptr_shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_ptr
                *target_function)

{
  cni_holder<void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
  *this;
  _func_void_Channel<cs_impl::any>_ptr_shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_ptr
  *local_18;
  
  this = (cni_holder<void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
          *)operator_new(0x28);
  local_18 = val;
  cni_holder<void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&,_const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
  ::cni_holder(this,&local_18);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}